

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.c
# Opt level: O0

BOOL tokens_equal(Token *t1,Token *t2)

{
  int iVar1;
  bool local_2c;
  bool local_2b;
  bool local_2a;
  bool local_29;
  Token *t2_local;
  Token *t1_local;
  
  if (t1->type == t2->type) {
    switch(t1->type) {
    case TOK_DOLLAR_DATA_REGISTER:
    case TOK_DOLLAR_ADDRESS_REGISTER:
    case TOK_DOLLAR_GENERAL_REGISTER:
    case TOK_DOLLAR_AMODE:
    case TOK_DOLLAR_REVERSED_AMODE:
    case TOK_DOLLAR_NUMBER:
    case TOK_DOLLAR_AMODE_PTR:
    case TOK_DOLLAR_REVERSED_AMODE_PTR:
      local_29 = false;
      if (((t1->u).reginfo.which == (t2->u).reginfo.which) &&
         (local_29 = false, (t1->u).reginfo.size == (t2->u).reginfo.size)) {
        local_29 = (t1->u).reginfo.sgnd == (t2->u).reginfo.sgnd;
      }
      t1_local._4_4_ = (BOOL)local_29;
      break;
    case TOK_AMODE:
    case TOK_REVERSED_AMODE:
    case TOK_AMODE_PTR:
    case TOK_REVERSED_AMODE_PTR:
      local_2b = false;
      if (((t1->u).reginfo.sgnd == (t2->u).reginfo.sgnd) &&
         (local_2b = false, (t1->u).reginfo.size == (t2->u).reginfo.size)) {
        local_2b = (t1->u).reginfo.which == (t2->u).reginfo.which;
      }
      t1_local._4_4_ = (BOOL)local_2b;
      break;
    case TOK_IDENTIFIER:
    case TOK_QUOTED_STRING:
      iVar1 = strcmp((t1->u).string,(t2->u).string);
      t1_local._4_4_ = (BOOL)((iVar1 != 0 ^ 0xffU) & 1);
      break;
    case TOK_NUMBER:
      t1_local._4_4_ = (BOOL)((t1->u).string == (t2->u).string);
      break;
    default:
      t1_local._4_4_ = TRUE;
      break;
    case TOK_DATA_REGISTER:
    case TOK_ADDRESS_REGISTER:
    case TOK_TEMP_REGISTER:
      local_2c = false;
      if (((t1->u).reginfo.sgnd == (t2->u).reginfo.sgnd) &&
         (local_2c = false, (t1->u).reginfo.size == (t2->u).reginfo.size)) {
        local_2c = (t1->u).reginfo.which == (t2->u).reginfo.which;
      }
      t1_local._4_4_ = (BOOL)local_2c;
      break;
    case TOK_DEREF:
      local_2a = false;
      if ((t1->u).reginfo.sgnd == (t2->u).reginfo.sgnd) {
        local_2a = (t1->u).reginfo.size == (t2->u).reginfo.size;
      }
      t1_local._4_4_ = (BOOL)local_2a;
    }
  }
  else {
    t1_local._4_4_ = FALSE;
  }
  return t1_local._4_4_;
}

Assistant:

BOOL
tokens_equal (const Token *t1, const Token *t2)
{
  if (t1->type != t2->type)
    return FALSE;

  switch (t1->type) {
  case TOK_IDENTIFIER:
  case TOK_QUOTED_STRING:
    return !strcmp (t1->u.string, t2->u.string);
  case TOK_NUMBER:
    return (t1->u.n == t2->u.n);
  case TOK_DOLLAR_AMODE:
  case TOK_DOLLAR_REVERSED_AMODE:
  case TOK_DOLLAR_AMODE_PTR:
  case TOK_DOLLAR_REVERSED_AMODE_PTR:
  case TOK_DOLLAR_NUMBER:
  case TOK_DOLLAR_DATA_REGISTER:
  case TOK_DOLLAR_ADDRESS_REGISTER:
  case TOK_DOLLAR_GENERAL_REGISTER:
    return (t1->u.dollarinfo.which == t2->u.dollarinfo.which
	    && t1->u.dollarinfo.size == t2->u.dollarinfo.size
	    && t1->u.dollarinfo.sgnd == t2->u.dollarinfo.sgnd);
  case TOK_DEREF:
    return (t1->u.derefinfo.sgnd == t2->u.derefinfo.sgnd
	    && t1->u.derefinfo.size == t2->u.derefinfo.size);
  case TOK_AMODE:
  case TOK_REVERSED_AMODE:
  case TOK_AMODE_PTR:
  case TOK_REVERSED_AMODE_PTR:
    return (t1->u.amodeinfo.sgnd == t2->u.amodeinfo.sgnd
	    && t1->u.amodeinfo.size == t2->u.amodeinfo.size
	    && t1->u.amodeinfo.which == t2->u.amodeinfo.which);
  case TOK_DATA_REGISTER:
  case TOK_ADDRESS_REGISTER:
  case TOK_TEMP_REGISTER:
    return (t1->u.reginfo.sgnd == t2->u.reginfo.sgnd
	    && t1->u.reginfo.size == t2->u.reginfo.size
	    && t1->u.reginfo.which == t2->u.reginfo.which);
  default:
    return TRUE;
  }
}